

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O0

void __thiscall JtagAnalyzer::Setup(JtagAnalyzer *this)

{
  byte bVar1;
  AnalyzerChannelData *pAVar2;
  Channel local_50 [16];
  Channel local_40 [32];
  Channel local_20 [16];
  JtagAnalyzer *local_10;
  JtagAnalyzer *this_local;
  
  local_10 = this;
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mTms = pAVar2;
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mTck = pAVar2;
  Channel::Channel(local_20,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&(this->mSettings).mTdiChannel,local_20);
  Channel::~Channel(local_20);
  if ((bVar1 & 1) == 0) {
    this->mTdi = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    this->mTdi = pAVar2;
  }
  Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&(this->mSettings).mTdoChannel,local_40);
  Channel::~Channel(local_40);
  if ((bVar1 & 1) == 0) {
    this->mTdo = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    this->mTdo = pAVar2;
  }
  Channel::Channel(local_50,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&(this->mSettings).mTrstChannel,local_50);
  Channel::~Channel(local_50);
  if ((bVar1 & 1) == 0) {
    this->mTrst = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
    this->mTrst = pAVar2;
  }
  return;
}

Assistant:

void JtagAnalyzer::Setup()
{
    // get the channel data pointers
    mTms = GetAnalyzerChannelData( mSettings.mTmsChannel );
    mTck = GetAnalyzerChannelData( mSettings.mTckChannel );
    if( mSettings.mTdiChannel != UNDEFINED_CHANNEL )
        mTdi = GetAnalyzerChannelData( mSettings.mTdiChannel );
    else
        mTdi = NULL;

    if( mSettings.mTdoChannel != UNDEFINED_CHANNEL )
        mTdo = GetAnalyzerChannelData( mSettings.mTdoChannel );
    else
        mTdo = NULL;

    if( mSettings.mTrstChannel != UNDEFINED_CHANNEL )
        mTrst = GetAnalyzerChannelData( mSettings.mTrstChannel );
    else
        mTrst = NULL;
}